

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void fiber_switch(Fiber *from,Fiber *to)

{
  if (from == to) {
    return;
  }
  if ((from->state & 1) == 0) {
    __assert_fail("fiber_is_executing(from)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x115,"void fiber_switch(Fiber *, Fiber *)");
  }
  if ((to->state & 1) != 0) {
    __assert_fail("!fiber_is_executing(to)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x116,"void fiber_switch(Fiber *, Fiber *)");
  }
  if ((to->state & 4) != 0) {
    from->state = from->state & 0xfffe;
    *(byte *)&to->state = (byte)to->state | 1;
    fiber_asm_switch();
    return;
  }
  __assert_fail("fiber_is_alive(to)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                0x117,"void fiber_switch(Fiber *, Fiber *)");
}

Assistant:

void
fiber_switch(Fiber *from, Fiber *to)
{
    NULL_CHECK(from, "Fiber cannot be NULL");
    NULL_CHECK(to, "Fiber cannot be NULL");

    if (from == to)
        return;

    assert(fiber_is_executing(from));
    assert(!fiber_is_executing(to));
    assert(fiber_is_alive(to));
    from->state &= ~FIBER_FS_EXECUTING;
    to->state |= FIBER_FS_EXECUTING;
    fiber_asm_switch(&from->regs, &to->regs);
}